

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O1

sc_signed * sc_dt::operator*(sc_signed *__return_storage_ptr__,long u,sc_signed *v)

{
  int iVar1;
  bool bVar2;
  byte bVar3;
  sc_length_param *psVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  bool bVar8;
  sc_digit ud [3];
  
  iVar1 = v->sgn;
  if (u < 1) {
    bVar3 = 1;
    if (u == 0) {
      iVar7 = 0;
    }
    else {
      iVar7 = -1;
      u = -u;
      bVar3 = 0;
    }
  }
  else {
    iVar7 = 1;
    bVar3 = 0;
  }
  if ((bool)(iVar1 == 0 | bVar3)) {
    psVar4 = sc_context<sc_dt::sc_length_param>::default_value();
    sc_signed::sc_signed(__return_storage_ptr__,psVar4->m_len);
  }
  else {
    if (u == 0) {
      bVar8 = true;
      uVar6 = 0;
    }
    else {
      uVar5 = 0;
      do {
        ud[uVar5] = (uint)u & 0x3fffffff;
        uVar6 = uVar5 + 1;
        bVar8 = uVar5 < 2;
        if (!bVar8) break;
        bVar2 = 0x3fffffff < (ulong)u;
        uVar5 = uVar6;
        u = (ulong)u >> 0x1e;
      } while (bVar2);
    }
    if (bVar8) {
      memset(ud + (uVar6 & 0xffffffff),0,(ulong)(2 - (int)uVar6) * 4 + 4);
    }
    mul_signed_friend(__return_storage_ptr__,(uint)(iVar1 == iVar7) * 2 + -1,0x40,3,ud,v->nbits,
                      v->ndigits,v->digit);
  }
  return __return_storage_ptr__;
}

Assistant:

sc_signed
operator*(long u, const sc_signed& v)
{

  small_type s = mul_signs(v.sgn, get_sign(u));

  if (s == SC_ZERO) // case 1
    return sc_signed();

  CONVERT_LONG_2(u);

  // cases 2-4
  return mul_signed_friend(s, BITS_PER_ULONG, DIGITS_PER_ULONG, ud,
                           v.nbits, v.ndigits, v.digit);

}